

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

RPCHelpMan * getblockfilter(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_03;
  string description_04;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  string *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  undefined8 uVar6;
  RPCHelpMan *in_RDI;
  long lVar7;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff728;
  undefined8 in_stack_fffffffffffff738;
  undefined8 in_stack_fffffffffffff740;
  undefined8 in_stack_fffffffffffff748;
  code *pcVar8;
  undefined8 in_stack_fffffffffffff750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff758;
  pointer in_stack_fffffffffffff768;
  pointer pRVar9;
  pointer in_stack_fffffffffffff770;
  pointer pRVar10;
  pointer in_stack_fffffffffffff778;
  pointer pRVar11;
  undefined8 in_stack_fffffffffffff780;
  pointer in_stack_fffffffffffff788;
  pointer pRVar12;
  pointer in_stack_fffffffffffff790;
  pointer pRVar13;
  pointer in_stack_fffffffffffff798;
  pointer pRVar14;
  undefined8 in_stack_fffffffffffff7a0;
  pointer in_stack_fffffffffffff7a8;
  pointer in_stack_fffffffffffff7b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff7b8;
  undefined1 auVar15 [32];
  undefined1 in_stack_fffffffffffff7c8 [48];
  _Alloc_hider in_stack_fffffffffffff7f8;
  _Alloc_hider _Var16;
  size_type in_stack_fffffffffffff800;
  undefined8 in_stack_fffffffffffff808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  ulong *local_748;
  undefined8 local_740;
  ulong local_738;
  undefined8 uStack_730;
  ulong *local_728;
  size_type local_720;
  ulong local_718;
  undefined8 uStack_710;
  long *local_708 [2];
  long local_6f8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_6e8;
  long *local_6c8 [2];
  long local_6b8 [2];
  pointer local_6a8 [2];
  undefined1 local_698 [152];
  RPCResult local_600;
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  RPCResult local_538;
  undefined1 local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined1 local_498;
  undefined7 uStack_497;
  undefined1 local_488 [32];
  long *local_468 [2];
  long local_458 [2];
  UniValue local_448;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  undefined1 local_398;
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370;
  vector<RPCArg,_std::allocator<RPCArg>_> local_368;
  undefined1 auStack_350 [8];
  undefined1 local_348 [32];
  long *local_328 [2];
  long local_318 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getblockfilter","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nRetrieve a BIP 157 content filter for a particular block.\n","");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"blockhash","");
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"The hash of the block","");
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_370 = 0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_2_ = 0;
  local_348._10_6_ = 0;
  local_348._16_2_ = 0;
  local_348._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff728;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff738;
  name.field_2._8_8_ = in_stack_fffffffffffff740;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff750;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff748;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff758;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff768;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff770;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff778;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff780;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff788;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff790;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff798;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff7a0;
  description_03._M_string_length = (size_type)in_stack_fffffffffffff7b0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7a8;
  description_03.field_2 = in_stack_fffffffffffff7b8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff7f8._M_p;
  auVar15 = in_stack_fffffffffffff7c8._8_32_;
  opts.skip_type_check = (bool)in_stack_fffffffffffff7c8[0];
  opts._1_7_ = in_stack_fffffffffffff7c8._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)auVar15._0_8_;
  opts.oneline_description._M_string_length = auVar15._8_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar15._16_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7c8._40_8_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff800;
  opts.hidden = (bool)(char)in_stack_fffffffffffff808;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff808 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffff808 >> 0x10);
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_03,opts);
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"filtertype","");
  val = BlockFilterTypeName_abi_cxx11_(BASIC);
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_448,val);
  paVar1 = &local_448.val.field_2;
  local_3f0._8_8_ = (long)&local_3f0 + 0x18;
  local_3f0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_448.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p == paVar1) {
    local_3f0._32_8_ = local_448.val.field_2._8_8_;
  }
  else {
    local_3f0._8_8_ = local_448.val._M_dataplus._M_p;
  }
  local_3f0._16_8_ = local_448.val._M_string_length;
  local_448.val._M_string_length = 0;
  local_448.val.field_2._M_local_buf[0] = '\0';
  local_3f0._40_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3f0._48_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3f0._56_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0._64_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_3f0._68_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_3f0._72_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_3f0._76_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_3f0._80_8_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398 = 2;
  local_468[0] = local_458;
  local_448.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,"The type name of the filter","");
  local_4a8 = &local_498;
  local_4b0 = 0;
  local_4a0 = 0;
  local_498 = 0;
  local_488._0_8_ = (pointer)0x0;
  local_488._8_2_ = 0;
  local_488._10_6_ = 0;
  local_488._16_2_ = 0;
  local_488._18_8_ = 0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff728;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff738;
  name_00.field_2._8_8_ = in_stack_fffffffffffff740;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff750;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff748;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff758;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff768;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff770;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff778;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff780;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff788;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff790;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff798;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff7a0;
  description_04._M_string_length = (size_type)in_stack_fffffffffffff7b0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7a8;
  description_04.field_2 = in_stack_fffffffffffff7b8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff7f8._M_p;
  auVar15 = in_stack_fffffffffffff7c8._8_32_;
  opts_00.skip_type_check = (bool)in_stack_fffffffffffff7c8[0];
  opts_00._1_7_ = in_stack_fffffffffffff7c8._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)auVar15._0_8_;
  opts_00.oneline_description._M_string_length = auVar15._8_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar15._16_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7c8._40_8_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff800;
  opts_00.hidden = (bool)(char)in_stack_fffffffffffff808;
  opts_00.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff808 >> 8);
  opts_00._66_6_ = (int6)((ulong)in_stack_fffffffffffff808 >> 0x10);
  RPCArg::RPCArg(&local_180,name_00,(Type)local_390,fallback_00,description_04,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff7e0,__l,
             (allocator_type *)&stack0xfffffffffffff7df);
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"");
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"");
  local_6a8[0] = (pointer)local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"filter","");
  local_6c8[0] = local_6b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c8,"the hex-encoded filter data","");
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff728;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff738;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff740;
  description._M_string_length = in_stack_fffffffffffff750;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff748;
  description.field_2 = in_stack_fffffffffffff758;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff770;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff768;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff778;
  RPCResult::RPCResult
            ((RPCResult *)(local_698 + 0x10),STR_HEX,m_key_name,description,inner,SUB81(local_6a8,0)
            );
  local_6e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_6e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"header","");
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_708,"the hex-encoded filter header","");
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff728;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff738;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff740;
  description_00._M_string_length = in_stack_fffffffffffff750;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff748;
  description_00.field_2._M_local_buf = in_stack_fffffffffffff758._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_600,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(&local_6e8,0))
  ;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)(local_698 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7a8,__l_00,
             (allocator_type *)&stack0xfffffffffffff767);
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff728;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff738;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff740;
  description_01._M_string_length = in_stack_fffffffffffff750;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff748;
  description_01.field_2 = in_stack_fffffffffffff758;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar9;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  RPCResult::RPCResult(&local_538,OBJ,m_key_name_01,description_01,inner_01,SUB81(local_558,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff728;
  result.m_key_name._M_string_length = in_stack_fffffffffffff738;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff740;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff748;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff750;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff758;
  result._64_8_ = pRVar9;
  result.m_description._M_dataplus._M_p = (pointer)pRVar10;
  result.m_description._M_string_length = (size_type)pRVar11;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff780;
  result.m_description.field_2._8_8_ = pRVar12;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar13;
  result.m_cond._M_string_length = (size_type)pRVar14;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff7a0;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff7a8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff7c0,result);
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"getblockfilter","");
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7a8,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\" \"basic\"","");
  HelpExampleCli(&local_768,&local_788,&local_7a8);
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"getblockfilter","");
  _Var16._M_p = &stack0xfffffffffffff808;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff7f8,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\", \"basic\"","");
  HelpExampleRpc(&local_7c8,&local_7e8,(string *)&stack0xfffffffffffff7f8);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    uVar6 = local_768.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_7c8._M_string_length + local_768._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      uVar6 = local_7c8.field_2._M_allocated_capacity;
    }
    if (local_7c8._M_string_length + local_768._M_string_length <= (ulong)uVar6) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_7c8,0,0,local_768._M_dataplus._M_p,local_768._M_string_length);
      goto LAB_009cc851;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_768,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
LAB_009cc851:
  local_748 = &local_738;
  puVar2 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_738 = paVar1->_M_allocated_capacity;
    uStack_730 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_738 = paVar1->_M_allocated_capacity;
    local_748 = puVar2;
  }
  local_720 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_748 == &local_738) {
    uStack_710 = uStack_730;
    local_728 = &local_718;
  }
  else {
    local_728 = local_748;
  }
  local_718 = local_738;
  local_740 = 0;
  local_738 = local_738 & 0xffffffffffffff00;
  pcVar8 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:2616:9)>
           ::_M_manager;
  description_02._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:2616:9)>
       ::_M_invoke;
  description_02._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:2616:9)>
                ::_M_manager;
  description_02.field_2 = in_stack_fffffffffffff758;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar10;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff780;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar13;
  examples.m_examples._M_string_length = in_stack_fffffffffffff7a0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar14;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff7a8;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff7b0;
  local_748 = &local_738;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff738)),description_02,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&stack0xfffffffffffff738,&stack0xfffffffffffff738,3);
  }
  if (local_728 != &local_718) {
    operator_delete(local_728,local_718 + 1);
  }
  if (local_748 != &local_738) {
    operator_delete(local_748,local_738 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if (_Var16._M_p != &stack0xfffffffffffff808) {
    operator_delete(_Var16._M_p,in_stack_fffffffffffff808 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.m_cond._M_dataplus._M_p != &local_538.m_cond.field_2) {
    operator_delete(local_538.m_cond._M_dataplus._M_p,
                    local_538.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.m_description._M_dataplus._M_p != &local_538.m_description.field_2) {
    operator_delete(local_538.m_description._M_dataplus._M_p,
                    local_538.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_538.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.m_key_name._M_dataplus._M_p != &local_538.m_key_name.field_2) {
    operator_delete(local_538.m_key_name._M_dataplus._M_p,
                    local_538.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7a8);
  lVar7 = 0x110;
  do {
    if ((long *)(local_698 + lVar7) != *(long **)((long)local_6a8 + lVar7)) {
      operator_delete(*(long **)((long)local_6a8 + lVar7),*(long *)(local_698 + lVar7) + 1);
    }
    if ((long *)((long)local_6b8 + lVar7) != *(long **)((long)local_6c8 + lVar7)) {
      operator_delete(*(long **)((long)local_6c8 + lVar7),*(long *)((long)local_6b8 + lVar7) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_6e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar7));
    if ((long *)((long)local_6f8 + lVar7) != *(long **)((long)local_708 + lVar7)) {
      operator_delete(*(long **)((long)local_708 + lVar7),*(long *)((long)local_6f8 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff768);
  if (local_708[0] != local_6f8) {
    operator_delete(local_708[0],local_6f8[0] + 1);
  }
  if (local_6e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_6e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_6e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_6e8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff788);
  if (local_6c8[0] != local_6b8) {
    operator_delete(local_6c8[0],local_6b8[0] + 1);
  }
  if (local_6a8[0] != (pointer)local_698) {
    operator_delete(local_6a8[0],local_698._0_8_ + 1);
  }
  if (local_578[0] != local_568) {
    operator_delete(local_578[0],local_568[0] + 1);
  }
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],local_548[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff7e0);
  lVar7 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar7));
    plVar3 = *(long **)((long)&local_308 + lVar7 + 0x40);
    plVar5 = (long *)((long)&local_308 + lVar7 + 0x50);
    if (plVar5 != plVar3) {
      operator_delete(plVar3,*plVar5 + 1);
    }
    plVar5 = (long *)((long)&local_308 + lVar7 + 0x28);
    plVar3 = *(long **)((long)&local_308 + lVar7 + 0x18);
    if (plVar5 != plVar3) {
      operator_delete(plVar3,*plVar5 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_350 + lVar7));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar7
               ));
    if ((long *)((long)local_380 + lVar7) != *(long **)((long)local_390 + lVar7)) {
      operator_delete(*(long **)((long)local_390 + lVar7),*(long *)((long)local_380 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x108;
  } while (lVar7 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_488);
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,CONCAT71(uStack_497,local_498) + 1);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_3f0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_448.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p != &local_448.val.field_2) {
    operator_delete(local_448.val._M_dataplus._M_p,
                    CONCAT71(local_448.val.field_2._M_allocated_capacity._1_7_,
                             local_448.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  if (local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblockfilter()
{
    return RPCHelpMan{"getblockfilter",
                "\nRetrieve a BIP 157 content filter for a particular block.\n",
                {
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The hash of the block"},
                    {"filtertype", RPCArg::Type::STR, RPCArg::Default{BlockFilterTypeName(BlockFilterType::BASIC)}, "The type name of the filter"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "filter", "the hex-encoded filter data"},
                        {RPCResult::Type::STR_HEX, "header", "the hex-encoded filter header"},
                    }},
                RPCExamples{
                    HelpExampleCli("getblockfilter", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\" \"basic\"") +
                    HelpExampleRpc("getblockfilter", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\", \"basic\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    uint256 block_hash = ParseHashV(request.params[0], "blockhash");
    std::string filtertype_name = BlockFilterTypeName(BlockFilterType::BASIC);
    if (!request.params[1].isNull()) {
        filtertype_name = request.params[1].get_str();
    }

    BlockFilterType filtertype;
    if (!BlockFilterTypeByName(filtertype_name, filtertype)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Unknown filtertype");
    }

    BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
    if (!index) {
        throw JSONRPCError(RPC_MISC_ERROR, "Index is not enabled for filtertype " + filtertype_name);
    }

    const CBlockIndex* block_index;
    bool block_was_connected;
    {
        ChainstateManager& chainman = EnsureAnyChainman(request.context);
        LOCK(cs_main);
        block_index = chainman.m_blockman.LookupBlockIndex(block_hash);
        if (!block_index) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
        block_was_connected = block_index->IsValid(BLOCK_VALID_SCRIPTS);
    }

    bool index_ready = index->BlockUntilSyncedToCurrentChain();

    BlockFilter filter;
    uint256 filter_header;
    if (!index->LookupFilter(block_index, filter) ||
        !index->LookupFilterHeader(block_index, filter_header)) {
        int err_code;
        std::string errmsg = "Filter not found.";

        if (!block_was_connected) {
            err_code = RPC_INVALID_ADDRESS_OR_KEY;
            errmsg += " Block was not connected to active chain.";
        } else if (!index_ready) {
            err_code = RPC_MISC_ERROR;
            errmsg += " Block filters are still in the process of being indexed.";
        } else {
            err_code = RPC_INTERNAL_ERROR;
            errmsg += " This error is unexpected and indicates index corruption.";
        }

        throw JSONRPCError(err_code, errmsg);
    }

    UniValue ret(UniValue::VOBJ);
    ret.pushKV("filter", HexStr(filter.GetEncodedFilter()));
    ret.pushKV("header", filter_header.GetHex());
    return ret;
},
    };
}